

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void randomFunc(sqlite3_context *context,int NotUsed,sqlite3_value **NotUsed2)

{
  Mem *pMem;
  long in_FS_OFFSET;
  sqlite_int64 r;
  undefined1 *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  sqlite3_randomness(8,&local_20);
  if ((long)local_20 < 0) {
    local_20 = (undefined1 *)-((ulong)local_20 & 0x7fffffffffffffff);
  }
  pMem = context->pOut;
  if ((pMem->flags & 0x9000) == 0) {
    (pMem->u).i = (i64)local_20;
    pMem->flags = 4;
  }
  else {
    vdbeReleaseAndSetInt64(pMem,(i64)local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void randomFunc(
  sqlite3_context *context,
  int NotUsed,
  sqlite3_value **NotUsed2
){
  sqlite_int64 r;
  UNUSED_PARAMETER2(NotUsed, NotUsed2);
  sqlite3_randomness(sizeof(r), &r);
  if( r<0 ){
    /* We need to prevent a random number of 0x8000000000000000
    ** (or -9223372036854775808) since when you do abs() of that
    ** number of you get the same value back again.  To do this
    ** in a way that is testable, mask the sign bit off of negative
    ** values, resulting in a positive value.  Then take the
    ** 2s complement of that positive value.  The end result can
    ** therefore be no less than -9223372036854775807.
    */
    r = -(r & LARGEST_INT64);
  }
  sqlite3_result_int64(context, r);
}